

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O0

_Bool history_is_artifact_known(player *p,artifact *artifact)

{
  _Bool _Var1;
  size_t sVar2;
  size_t local_30;
  size_t i;
  player_history *h;
  artifact *artifact_local;
  player *p_local;
  
  local_30 = (p->hist).next;
  if (artifact == (artifact *)0x0) {
    __assert_fail("artifact",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-history.c"
                  ,0x90,"_Bool history_is_artifact_known(struct player *, const struct artifact *)")
    ;
  }
  do {
    sVar2 = local_30 - 1;
    if (local_30 == 0) {
      return false;
    }
    _Var1 = flag_has_dbg((p->hist).entries[sVar2].type,2,3,"h->entries[i].type",
                         "HIST_ARTIFACT_KNOWN");
    local_30 = sVar2;
  } while ((!_Var1) || ((uint)(p->hist).entries[sVar2].a_idx != artifact->aidx));
  return true;
}

Assistant:

bool history_is_artifact_known(struct player *p, const struct artifact *artifact)
{
	struct player_history *h = &p->hist;

	size_t i = h->next;
	assert(artifact);

	while (i--) {
		if (hist_has(h->entries[i].type, HIST_ARTIFACT_KNOWN) &&
				h->entries[i].a_idx == artifact->aidx)
			return true;
	}

	return false;
}